

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

void __thiscall
NNTreeIterator::resetLimits(NNTreeIterator *this,QPDFObjectHandle *node,iterator parent)

{
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *plVar1;
  NNTreeDetails *pNVar2;
  QPDF *qpdf;
  QPDFObjectHandle *pQVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  QPDFObjectHandle first_limits;
  allocator<char> local_141;
  NNTreeIterator *local_140;
  QPDFObjectHandle last_kid;
  QPDFObjectHandle ofirst;
  QPDFObjectHandle last;
  QPDFObjectHandle first;
  _List_node_base *local_d8;
  QPDFObjectHandle last_limits;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_c0;
  QPDFObjectHandle first_kid;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  QPDFObjectHandle items;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  QPDFObjectHandle kids;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  plVar1 = &this->path;
  bVar4 = false;
  local_140 = this;
  local_d8 = parent._M_node;
  do {
    if (bVar4) {
      return;
    }
    if (local_d8 == (_List_node_base *)plVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ofirst,"/Limits",(allocator<char> *)&kids);
      QPDFObjectHandle::removeKey(node,(string *)&ofirst);
      std::__cxx11::string::~string((string *)&ofirst);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ofirst,"/Kids",(allocator<char> *)&items);
    QPDFObjectHandle::getKey(&kids,(string *)node);
    std::__cxx11::string::~string((string *)&ofirst);
    bVar4 = QPDFObjectHandle::isArray(&kids);
    iVar6 = 0;
    if (bVar4) {
      iVar6 = QPDFObjectHandle::getArrayNItems(&kids);
    }
    (*(code *)**(undefined8 **)local_140->impl->details)();
    QPDFObjectHandle::getKey(&items,(string *)node);
    bVar4 = QPDFObjectHandle::isArray(&items);
    iVar7 = 0;
    if (bVar4) {
      iVar7 = QPDFObjectHandle::getArrayNItems(&items);
    }
    first.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    first.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    last.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    last.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (iVar7 < 2) {
      if (0 < iVar6) {
        iVar6 = (int)&kids;
        QPDFObjectHandle::getArrayItem(&first_kid,iVar6);
        QPDFObjectHandle::getArrayItem(&last_kid,iVar6);
        bVar4 = QPDFObjectHandle::isDictionary(&first_kid);
        if ((bVar4) && (bVar4 = QPDFObjectHandle::isDictionary(&last_kid), bVar4)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ofirst,"/Limits",(allocator<char> *)&last_limits);
          QPDFObjectHandle::getKey(&first_limits,(string *)&first_kid);
          std::__cxx11::string::~string((string *)&ofirst);
          std::__cxx11::string::string<std::allocator<char>>((string *)&ofirst,"/Limits",&local_141)
          ;
          QPDFObjectHandle::getKey(&last_limits,(string *)&last_kid);
          std::__cxx11::string::~string((string *)&ofirst);
          bVar4 = QPDFObjectHandle::isArray(&first_limits);
          if ((bVar4) &&
             (((iVar6 = QPDFObjectHandle::getArrayNItems(&first_limits), 1 < iVar6 &&
               (bVar4 = QPDFObjectHandle::isArray(&last_limits), bVar4)) &&
              (iVar6 = QPDFObjectHandle::getArrayNItems(&last_limits), 1 < iVar6)))) {
            QPDFObjectHandle::getArrayItem(&ofirst,(int)&first_limits);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&first,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ofirst);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&ofirst.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            QPDFObjectHandle::getArrayItem(&ofirst,(int)&last_limits);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&last,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ofirst);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&ofirst.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&last_limits.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&first_limits.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&last_kid.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        pQVar3 = &first_kid;
        goto LAB_0012ad5a;
      }
    }
    else {
      QPDFObjectHandle::getArrayItem(&ofirst,(int)&items);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&first,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ofirst);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ofirst.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::getArrayItem(&ofirst,(int)&items);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&last,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ofirst);
      pQVar3 = &ofirst;
LAB_0012ad5a:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(pQVar3->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    if ((first.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr == (element_type *)0x0) ||
       (last.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0)) {
      qpdf = local_140->impl->qpdf;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ofirst,"unable to determine limits",(allocator<char> *)&first_kid);
      warn(qpdf,node,(string *)&ofirst);
      std::__cxx11::string::~string((string *)&ofirst);
LAB_0012af94:
      if (local_d8 ==
          (plVar1->
          super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
          )._M_impl._M_node.super__List_node_base._M_next) goto LAB_0012b091;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)node,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 1));
      local_d8 = local_d8->_M_prev;
      bVar4 = false;
    }
    else {
      QPDFObjectHandle::newArray();
      QPDFObjectHandle::appendItem(&first_kid,&first);
      QPDFObjectHandle::appendItem(&first_kid,&last);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ofirst,"/Limits",(allocator<char> *)&first_limits);
      QPDFObjectHandle::getKey(&last_kid,(string *)node);
      std::__cxx11::string::~string((string *)&ofirst);
      bVar4 = QPDFObjectHandle::isArray(&last_kid);
      if ((!bVar4) || (iVar6 = QPDFObjectHandle::getArrayNItems(&last_kid), iVar6 != 2)) {
LAB_0012af03:
        bVar4 = QPDFObjectHandle::isSameObjectAs
                          (node,(QPDFObjectHandle *)
                                ((plVar1->
                                 super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                                 )._M_impl._M_node.super__List_node_base._M_next + 1));
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ofirst,"/Limits",(allocator<char> *)&first_limits);
          QPDFObjectHandle::replaceKey(node,(string *)&ofirst,&first_kid);
          std::__cxx11::string::~string((string *)&ofirst);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&last_kid.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&first_kid.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        goto LAB_0012af94;
      }
      QPDFObjectHandle::getArrayItem(&ofirst,(int)&last_kid);
      QPDFObjectHandle::getArrayItem(&first_limits,(int)&last_kid);
      pNVar2 = local_140->impl->details;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_c0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ofirst);
      cVar5 = (**(code **)(*(long *)pNVar2 + 8))(pNVar2,&local_c0);
      if (cVar5 == '\0') {
LAB_0012aee2:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&first_limits.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ofirst.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        goto LAB_0012af03;
      }
      pNVar2 = local_140->impl->details;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&first_limits);
      cVar5 = (**(code **)(*(long *)pNVar2 + 8))(pNVar2,&local_90);
      if (cVar5 == '\0') {
LAB_0012aed5:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
        goto LAB_0012aee2;
      }
      pNVar2 = local_140->impl->details;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&first);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&ofirst);
      iVar6 = (**(code **)(*(long *)pNVar2 + 0x10))(pNVar2,&local_a0,&local_60);
      if (iVar6 != 0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
        goto LAB_0012aed5;
      }
      pNVar2 = local_140->impl->details;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&last);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&first_limits);
      iVar6 = (**(code **)(*(long *)pNVar2 + 0x10))(pNVar2,&local_70,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&first_limits.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ofirst.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (iVar6 != 0) goto LAB_0012af03;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&last_kid.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&first_kid.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_0012b091:
      bVar4 = true;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&last.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&first.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&items.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  } while( true );
}

Assistant:

void
NNTreeIterator::resetLimits(QPDFObjectHandle node, std::list<PathElement>::iterator parent)
{
    bool done = false;
    while (!done) {
        if (parent == this->path.end()) {
            QTC::TC("qpdf", "NNTree remove limits from root");
            node.removeKey("/Limits");
            done = true;
            break;
        }
        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(impl.details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;

        bool changed = true;
        QPDFObjectHandle first;
        QPDFObjectHandle last;
        if (nitems >= 2) {
            first = items.getArrayItem(0);
            last = items.getArrayItem((nitems - 1) & ~1);
        } else if (nkids > 0) {
            auto first_kid = kids.getArrayItem(0);
            auto last_kid = kids.getArrayItem(nkids - 1);
            if (first_kid.isDictionary() && last_kid.isDictionary()) {
                auto first_limits = first_kid.getKey("/Limits");
                auto last_limits = last_kid.getKey("/Limits");
                if (first_limits.isArray() && (first_limits.getArrayNItems() >= 2) &&
                    last_limits.isArray() && (last_limits.getArrayNItems() >= 2)) {
                    first = first_limits.getArrayItem(0);
                    last = last_limits.getArrayItem(1);
                }
            }
        }
        if (first && last) {
            auto limits = QPDFObjectHandle::newArray();
            limits.appendItem(first);
            limits.appendItem(last);
            auto olimits = node.getKey("/Limits");
            if (olimits.isArray() && (olimits.getArrayNItems() == 2)) {
                auto ofirst = olimits.getArrayItem(0);
                auto olast = olimits.getArrayItem(1);
                if (impl.details.keyValid(ofirst) && impl.details.keyValid(olast) &&
                    (impl.details.compareKeys(first, ofirst) == 0) &&
                    (impl.details.compareKeys(last, olast) == 0)) {
                    QTC::TC("qpdf", "NNTree limits didn't change");
                    changed = false;
                }
            }
            if (changed && !node.isSameObjectAs(path.begin()->node)) {
                node.replaceKey("/Limits", limits);
            }
        } else {
            QTC::TC("qpdf", "NNTree unable to determine limits");
            warn(impl.qpdf, node, "unable to determine limits");
        }

        if ((!changed) || (parent == this->path.begin())) {
            done = true;
        } else {
            node = parent->node;
            --parent;
        }
    }
}